

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O1

void __thiscall QDataWidgetMapperPrivate::commitData(QDataWidgetMapperPrivate *this,QWidget *w)

{
  pointer pWVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->submitPolicy != ManualSubmit) {
    iVar2 = findWidget(this,w);
    if (iVar2 != -1) {
      uVar3 = (ulong)iVar2;
      pWVar1 = (this->widgetMap).
               super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->widgetMap).
                     super__Vector_base<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pWVar1 >> 3) *
              0x6db6db6db6db6db7;
      if (uVar3 <= uVar4 && uVar4 - uVar3 != 0) {
        commit(this,pWVar1 + uVar3);
        return;
      }
      commitData();
    }
  }
  return;
}

Assistant:

void QDataWidgetMapperPrivate::commitData(QWidget *w)
{
    if (submitPolicy == QDataWidgetMapper::ManualSubmit)
        return;

    int idx = findWidget(w);
    if (idx == -1)
        return; // not our widget

    commit(widgetMap[idx]);
}